

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<wasm::(anonymous_namespace)::CollectedFuncInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::ParallelFunctionAnalysis::Mapper::~Mapper(Mapper *this)

{
  Mapper *this_local;
  
  ~Mapper(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }